

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketAcceptor::onInitialize(ThreadedSocketAcceptor *this,SessionSettings *s)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool reuse;
  int iVar3;
  Dictionary *this_00;
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  *this_01;
  _Base_ptr p_Var4;
  undefined7 extraout_var;
  mapped_type_conflict *pmVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  long *plVar10;
  size_type *psVar11;
  int port;
  undefined1 auVar12 [12];
  socket_handle socket;
  SocketException e;
  set<int,_std::less<int>,_std::allocator<int>_> ports;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  socket_handle local_234;
  int local_230;
  undefined4 local_22c;
  undefined1 local_228 [84];
  int local_1d4;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_150;
  SocketToPort *local_148;
  PortToSessions *local_140;
  SessionSettings *local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_60;
  
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138 = s;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_60,s);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    local_140 = &this->m_portToSessions;
    local_148 = &this->m_socketToPort;
    local_150 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                &this->m_sockets;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      this_00 = SessionSettings::get(local_138,(SessionID *)(p_Var6 + 1));
      local_228._0_8_ = local_228 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"SocketAcceptPort","");
      iVar3 = Dictionary::getInt(this_00,(string *)local_228);
      if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      port = (int)(short)iVar3;
      local_228._0_4_ = port;
      local_1d4 = iVar3;
      this_01 = (_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
                 *)std::
                   map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
                   ::operator[](local_140,(key_type *)local_228);
      std::
      _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
      ::_M_insert_unique<FIX::SessionID_const&>(this_01,(SessionID *)(p_Var6 + 1));
      p_Var4 = &local_d0._M_impl.super__Rb_tree_header._M_header;
      for (p_Var8 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
          p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < port]) {
        if (port <= (int)*(size_t *)(p_Var8 + 1)) {
          p_Var4 = p_Var8;
        }
      }
      p_Var1 = &local_d0._M_impl.super__Rb_tree_header;
      p_Var9 = p_Var1;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var9 = (_Rb_tree_header *)p_Var4, port < (int)((_Rb_tree_header *)p_Var4)->_M_node_count
         )) {
        p_Var9 = p_Var1;
      }
      if (p_Var9 == p_Var1) {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_d0,(int *)local_228);
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"SocketReuseAddress","")
        ;
        bVar2 = Dictionary::has(this_00,(string *)local_228);
        reuse = true;
        if (bVar2) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"SocketReuseAddress","");
          reuse = Dictionary::getBool(this_00,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"SocketNodelay","");
        bVar2 = Dictionary::has(this_00,(string *)local_228);
        if (bVar2) {
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"SocketNodelay","");
          bVar2 = Dictionary::getBool(this_00,&local_190);
          local_22c = (undefined4)CONCAT71(extraout_var,bVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_22c = 0;
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"SocketSendBufferSize","");
        bVar2 = Dictionary::has(this_00,(string *)local_228);
        local_230 = 0;
        if (bVar2) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"SocketSendBufferSize","");
          local_230 = Dictionary::getInt(this_00,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"SocketReceiveBufferSize","");
        bVar2 = Dictionary::has(this_00,(string *)local_228);
        iVar3 = 0;
        if (bVar2) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"SocketReceiveBufferSize","");
          iVar3 = Dictionary::getInt(this_00,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        local_234 = socket_createAcceptor(port,reuse);
        if (local_234 == -1) {
          SocketException::SocketException((SocketException *)local_228);
          socket_close(local_234);
          auVar12 = __cxa_allocate_exception(0x50);
          IntConvertor::convert_abi_cxx11_
                    (&local_a0,(IntConvertor *)(ulong)(ushort)local_1d4,auVar12._8_4_);
          std::operator+(&local_80,"Unable to create, bind, or listen to port ",&local_a0);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
          local_130 = (long *)*plVar7;
          plVar10 = plVar7 + 2;
          if (local_130 == plVar10) {
            local_120 = *plVar10;
            lStack_118 = plVar7[3];
            local_130 = &local_120;
          }
          else {
            local_120 = *plVar10;
          }
          local_128 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::logic_error::what();
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_110 = (long *)*plVar7;
          plVar10 = plVar7 + 2;
          if (local_110 == plVar10) {
            local_100 = *plVar10;
            lStack_f8 = plVar7[3];
            local_110 = &local_100;
          }
          else {
            local_100 = *plVar10;
          }
          local_108 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_f0._M_dataplus._M_p = (pointer)*plVar7;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_f0._M_dataplus._M_p == psVar11) {
            local_f0.field_2._M_allocated_capacity = *psVar11;
            local_f0.field_2._8_8_ = plVar7[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar11;
          }
          local_f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          RuntimeError::RuntimeError(auVar12._0_8_,&local_f0);
          __cxa_throw(auVar12._0_8_,&RuntimeError::typeinfo,FIX::Exception::~Exception);
        }
        if ((char)local_22c != '\0') {
          socket_setsockopt(local_234,1);
        }
        if (local_230 != 0) {
          socket_setsockopt(local_234,7,local_230);
        }
        if (iVar3 != 0) {
          socket_setsockopt(local_234,8,iVar3);
        }
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](local_148,&local_234);
        *pmVar5 = port;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_150,&local_234);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_d0);
  return;
}

Assistant:

void ThreadedSocketAcceptor::onInitialize( const SessionSettings& s )
EXCEPT ( RuntimeError )
{
  short port = 0;
  std::set<int> ports;

  std::set<SessionID> sessions = s.getSessions();
  std::set<SessionID>::iterator i = sessions.begin();
  for( ; i != sessions.end(); ++i )
  {
    const Dictionary& settings = s.get( *i );
    port = (short)settings.getInt( SOCKET_ACCEPT_PORT );

    m_portToSessions[port].insert( *i );

    if( ports.find(port) != ports.end() )
      continue;
    ports.insert( port );

    const bool reuseAddress = settings.has( SOCKET_REUSE_ADDRESS ) ? 
      settings.getBool( SOCKET_REUSE_ADDRESS ) : true;

    const bool noDelay = settings.has( SOCKET_NODELAY ) ? 
      settings.getBool( SOCKET_NODELAY ) : false;

    const int sendBufSize = settings.has( SOCKET_SEND_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_SEND_BUFFER_SIZE ) : 0;

    const int rcvBufSize = settings.has( SOCKET_RECEIVE_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_RECEIVE_BUFFER_SIZE ) : 0;

    socket_handle socket = socket_createAcceptor( port, reuseAddress );
    if( socket == INVALID_SOCKET_HANDLE )
    {
      SocketException e;
      socket_close( socket );
      throw RuntimeError( "Unable to create, bind, or listen to port " 
                         + IntConvertor::convert( (unsigned short)port ) + " (" + e.what() + ")" );
    }
    if( noDelay )
      socket_setsockopt( socket, TCP_NODELAY );
    if( sendBufSize )
      socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
    if( rcvBufSize )
      socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );

    m_socketToPort[socket] = port;
    m_sockets.insert( socket );
  }    
}